

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte *in_RSI;
  byte *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  
  *in_RDI = *in_RSI & 1;
  pbVar1 = internal::
           scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 8));
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(in_RSI + 8));
    std::__cxx11::string::string((string *)local_50,(string *)pbVar1);
  }
  internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 8),local_50);
  return;
}

Assistant:

AssertionResult::AssertionResult(const AssertionResult& other)
    : success_(other.success_),
      message_(other.message_.get() != nullptr
                   ? new ::std::string(*other.message_)
                   : static_cast< ::std::string*>(nullptr)) {}